

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_LRU.cc
# Opt level: O0

void __thiscall MyDB_LRU::adjust(MyDB_LRU *this,pair<std::shared_ptr<MyDB_Table>,_long> *curId)

{
  Node *pNVar1;
  bool bVar2;
  pointer ppVar3;
  Node *node;
  _Self local_20;
  iterator it_LRUmap;
  pair<std::shared_ptr<MyDB_Table>,_long> *curId_local;
  MyDB_LRU *this_local;
  
  it_LRUmap._M_node = (_Base_ptr)curId;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
       ::find(&this->LRUmap,curId);
  node = (Node *)std::
                 map<std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*,_std::less<std::pair<std::shared_ptr<MyDB_Table>,_long>_>,_std::allocator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>_>
                 ::end(&this->LRUmap);
  bVar2 = std::operator!=(&local_20,(_Self *)&node);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<std::shared_ptr<MyDB_Table>,_long>,_Node_*>_>
             ::operator->(&local_20);
    pNVar1 = ppVar3->second;
    pNVar1->pre->next = pNVar1->next;
    pNVar1->next->pre = pNVar1->pre;
    pNVar1->pre = this->head;
    pNVar1->next = this->head->next;
    this->head->next->pre = pNVar1;
    this->head->next = pNVar1;
  }
  return;
}

Assistant:

void MyDB_LRU:: adjust(pair<MyDB_TablePtr, long> curId) {
    map<pair<MyDB_TablePtr, long>, Node*>:: iterator it_LRUmap = LRUmap.find(curId);
    if (it_LRUmap != LRUmap.end()) {
        Node* node = it_LRUmap -> second;
        node -> pre -> next = node -> next;
        node -> next -> pre = node -> pre;
        node -> pre = this -> head;
        node -> next = this -> head -> next;
        this -> head -> next -> pre = node;
        this -> head -> next = node;
    }
}